

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSettingsInstallHandler(ImGuiContext *context)

{
  ImGuiSettingsHandler *__src;
  ImGuiID IVar1;
  int iVar2;
  ImGuiSettingsHandler *__dest;
  int iVar3;
  int iVar4;
  
  IVar1 = ImHashStr("Table",0,0);
  iVar2 = (context->SettingsHandlers).Size;
  if (iVar2 == (context->SettingsHandlers).Capacity) {
    if (iVar2 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar2 / 2 + iVar2;
    }
    iVar4 = iVar2 + 1;
    if (iVar2 + 1 < iVar3) {
      iVar4 = iVar3;
    }
    __dest = (ImGuiSettingsHandler *)MemAlloc((long)iVar4 * 0x48);
    __src = (context->SettingsHandlers).Data;
    if (__src != (ImGuiSettingsHandler *)0x0) {
      memcpy(__dest,__src,(long)(context->SettingsHandlers).Size * 0x48);
      MemFree((context->SettingsHandlers).Data);
    }
    (context->SettingsHandlers).Data = __dest;
    (context->SettingsHandlers).Capacity = iVar4;
    iVar2 = (context->SettingsHandlers).Size;
  }
  else {
    __dest = (context->SettingsHandlers).Data;
  }
  __dest[iVar2].TypeName = "Table";
  __dest[iVar2].TypeHash = IVar1;
  *(undefined4 *)&__dest[iVar2].field_0xc = 0;
  __dest[iVar2].ClearAllFn = TableSettingsHandler_ClearAll;
  __dest[iVar2].ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  __dest[iVar2].ReadOpenFn = TableSettingsHandler_ReadOpen;
  __dest[iVar2].ReadLineFn = TableSettingsHandler_ReadLine;
  __dest[iVar2].ApplyAllFn = TableSettingsHandler_ApplyAll;
  __dest[iVar2].WriteAllFn = TableSettingsHandler_WriteAll;
  __dest[iVar2].UserData = (void *)0x0;
  (context->SettingsHandlers).Size = (context->SettingsHandlers).Size + 1;
  return;
}

Assistant:

void ImGui::TableSettingsInstallHandler(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Table";
    ini_handler.TypeHash = ImHashStr("Table");
    ini_handler.ClearAllFn = TableSettingsHandler_ClearAll;
    ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
    ini_handler.ApplyAllFn = TableSettingsHandler_ApplyAll;
    ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}